

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::syntax::ElementSelectSyntax_const*>::
emplace_back<slang::syntax::ElementSelectSyntax_const*const&>
          (SmallVectorBase<slang::syntax::ElementSelectSyntax_const*> *this,
          ElementSelectSyntax **args)

{
  reference ppEVar1;
  ulong uVar2;
  SmallVectorBase<slang::syntax::ElementSelectSyntax_const*> *__src;
  void *__dest;
  SmallVectorBase<slang::syntax::ElementSelectSyntax_const*> *__src_00;
  long lVar3;
  ulong uVar4;
  
  lVar3 = *(long *)(this + 8);
  __src_00 = (SmallVectorBase<slang::syntax::ElementSelectSyntax_const*> *)
             (lVar3 * 8 + *(long *)this);
  if (lVar3 != *(long *)(this + 0x10)) {
    *(ElementSelectSyntax **)__src_00 = *args;
    *(long *)(this + 8) = lVar3 + 1;
    return (reference)(*(long *)this + lVar3 * 8);
  }
  if (*(long *)(this + 8) != 0xfffffffffffffff) {
    uVar4 = *(long *)(this + 8) + 1;
    uVar2 = *(ulong *)(this + 0x10);
    if (uVar4 < uVar2 * 2) {
      uVar4 = uVar2 * 2;
    }
    if (0xfffffffffffffff - uVar2 < uVar2) {
      uVar4 = 0xfffffffffffffff;
    }
    lVar3 = *(long *)this;
    __dest = operator_new(uVar4 * 8);
    ppEVar1 = (reference)((long)__dest + ((long)__src_00 - lVar3));
    *(ElementSelectSyntax **)((long)__dest + ((long)__src_00 - lVar3)) = *args;
    __src = *(SmallVectorBase<slang::syntax::ElementSelectSyntax_const*> **)this;
    lVar3 = *(long *)(this + 8);
    if (__src + (lVar3 * 8 - (long)__src_00) ==
        (SmallVectorBase<slang::syntax::ElementSelectSyntax_const*> *)0x0) {
      if (lVar3 != 0) {
        memmove(__dest,__src,lVar3 * 8);
      }
    }
    else {
      if (__src != __src_00) {
        memmove(__dest,__src,(long)__src_00 - (long)__src);
      }
      memcpy(ppEVar1 + 1,__src_00,(size_t)(__src + (lVar3 * 8 - (long)__src_00)));
    }
    if (__src != this + 0x18) {
      operator_delete(__src);
      lVar3 = *(long *)(this + 8);
    }
    *(long *)(this + 8) = lVar3 + 1;
    *(ulong *)(this + 0x10) = uVar4;
    *(void **)this = __dest;
    return ppEVar1;
  }
  detail::throwLengthError();
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }